

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

void __thiscall QAccessibleWidget::addControllingSignal(QAccessibleWidget *this,QString *signal)

{
  QStringList *this_00;
  QAccessibleWidgetPrivate *pQVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  storage_type *psVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QString local_88;
  QArrayData *local_68;
  storage_type *psStack_60;
  storage_type *local_58;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QString *)&local_48);
  QMetaObject::normalizedSignature((char *)&local_68);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
  puVar3 = (undefined8 *)(**(code **)(*(long *)this + 0x18))(this);
  pcVar4 = (char *)(**(code **)*puVar3)(puVar3);
  iVar2 = QMetaObject::indexOfSignal(pcVar4);
  if (iVar2 < 0) {
    addControllingSignal();
  }
  pQVar1 = this->d;
  this_00 = &pQVar1->primarySignals;
  psVar5 = psStack_60;
  if (psStack_60 != (storage_type *)0x0) {
    psVar5 = local_58;
  }
  QVar6.m_data = psVar5;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar6);
  local_88.d.d = (Data *)local_48;
  local_88.d.ptr = pcStack_40;
  local_88.d.size = local_38;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)this_00,(pQVar1->primarySignals).d.size,&local_88);
  QList<QString>::end(this_00);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleWidget::addControllingSignal(const QString &signal)
{
    QByteArray s = QMetaObject::normalizedSignature(signal.toLatin1());
    if (Q_UNLIKELY(object()->metaObject()->indexOfSignal(s) < 0))
        qWarning("Signal %s unknown in %s", s.constData(), object()->metaObject()->className());
    d->primarySignals << QLatin1StringView(s);
}